

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O3

void lz_decoder_end(void *coder_ptr,lzma_allocator *allocator)

{
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x58),allocator);
  lzma_free(*coder_ptr,allocator);
  if (*(code **)((long)coder_ptr + 0x50) == (code *)0x0) {
    lzma_free(*(void **)((long)coder_ptr + 0x30),allocator);
  }
  else {
    (**(code **)((long)coder_ptr + 0x50))();
  }
  lzma_free(coder_ptr,allocator);
  return;
}

Assistant:

static void
lz_decoder_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_coder *coder = coder_ptr;

	lzma_next_end(&coder->next, allocator);
	lzma_free(coder->dict.buf, allocator);

	if (coder->lz.end != NULL)
		coder->lz.end(coder->lz.coder, allocator);
	else
		lzma_free(coder->lz.coder, allocator);

	lzma_free(coder, allocator);
	return;
}